

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BitMap.cpp
# Opt level: O0

size_t axl::sl::findBit(size_t *map,size_t pageCount,size_t from)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  uint64_t uVar4;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  size_t *end;
  size_t x;
  size_t *p;
  size_t i;
  uint64_t in_stack_ffffffffffffffb0;
  ulong *local_30;
  size_t local_8;
  
  uVar3 = in_RDX >> 6;
  if (uVar3 < in_RSI) {
    local_30 = (ulong *)(in_RDI + uVar3 * 8);
    uVar1 = *local_30;
    uVar4 = getHiBitmask64(in_RDX & 0x3f);
    if ((uVar1 & uVar4) == 0) {
      do {
        local_30 = local_30 + 1;
        if ((ulong *)(in_RDI + in_RSI * 8) <= local_30) {
          return 0xffffffffffffffff;
        }
      } while (*local_30 == 0);
      bVar2 = getLoBitIdx64(in_stack_ffffffffffffffb0);
      local_8 = ((long)local_30 - in_RDI >> 3) * 0x40 + (ulong)bVar2;
    }
    else {
      uVar4 = uVar3 << 6;
      bVar2 = getLoBitIdx64(uVar4);
      local_8 = uVar4 + bVar2;
    }
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

size_t
findBit(
	const size_t* map,
	size_t pageCount,
	size_t from
) {
	size_t i = from / AXL_PTR_BITS;
	if (i >= pageCount)
		return -1;

	const size_t* p = map + i;
	from &= AXL_PTR_BITS - 1;
	size_t x = *p & getHiBitmask(from);
	if (x)
		return i * AXL_PTR_BITS + getLoBitIdx(x);

	const size_t* end = map + pageCount;
	for (p++; p < end; p++)
		if (*p != 0)
			return (p - map) * AXL_PTR_BITS + getLoBitIdx(*p);

	return -1;
}